

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

string * google::protobuf::compiler::python::
         NamePrefixedWithNestedTypes<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *descriptor,string_view separator)

{
  ushort *puVar1;
  char **ppcVar2;
  char *pcVar3;
  Descriptor *descriptor_00;
  AlphaNum *in_R8;
  size_type __rlen;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view name;
  string_view separator_00;
  string prefix;
  size_type *local_118;
  python *local_110;
  size_type local_108;
  undefined8 uStack_100;
  string local_f8;
  string local_d8;
  undefined8 local_b8;
  char *local_b0;
  python *local_a8;
  size_type *local_a0;
  undefined8 local_98;
  char *local_90;
  AlphaNum local_88;
  AlphaNum local_58;
  
  separator_00._M_len = separator._M_str;
  descriptor_00 = (Descriptor *)separator._M_len;
  puVar1 = (ushort *)(descriptor->all_names_).payload_;
  pcVar3 = separator_00._M_len;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
  if (descriptor->containing_type_ == (Descriptor *)0x0) {
    if ((descriptor_00 == (Descriptor *)0x1) && (*separator_00._M_len == '.')) {
      name._M_str = pcVar3;
      name._M_len = (size_t)local_118;
      ResolveKeyword_abi_cxx11_(&local_d8,local_110,name);
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_118 == &local_108) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_108;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_100;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_118;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_108;
    }
    __return_storage_ptr__->_M_string_length = (size_type)local_110;
    return __return_storage_ptr__;
  }
  separator_00._M_str = (char *)in_R8;
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (&local_f8,(python *)descriptor->containing_type_,descriptor_00,separator_00);
  if ((descriptor_00 == (Descriptor *)0x1) && (*separator_00._M_len == '.')) {
    local_d8._M_dataplus._M_p = (pointer)local_110;
    local_d8._M_string_length = (size_type)local_118;
    ppcVar2 = std::
              __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                        (kKeywords,kKeywordsEnd);
    if (ppcVar2 != (char **)kKeywordsEnd) {
      local_d8._M_dataplus._M_p = &DAT_00000008;
      local_d8._M_string_length = 0x1303122;
      local_d8.field_2._M_allocated_capacity = local_f8._M_string_length;
      local_d8.field_2._8_8_ = local_f8._M_dataplus._M_p;
      local_b8 = 3;
      local_b0 = ", \'";
      local_a8 = local_110;
      local_a0 = local_118;
      local_98 = 2;
      local_90 = "\')";
      pieces._M_len = local_f8._M_string_length;
      pieces._M_array = (iterator)&DAT_00000005;
      absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                (__return_storage_ptr__,(strings_internal *)&local_d8,pieces);
      goto LAB_00e271c6;
    }
  }
  local_d8._M_dataplus._M_p = (pointer)local_f8._M_string_length;
  local_d8._M_string_length = (size_type)local_f8._M_dataplus._M_p;
  local_88.piece_._M_len = (size_t)local_110;
  local_88.piece_._M_str = (char *)local_118;
  local_58.piece_._M_len = (size_t)descriptor_00;
  local_58.piece_._M_str = separator_00._M_len;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_d8,&local_58,&local_88,in_R8);
LAB_00e271c6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        absl::string_view separator) {
  std::string name = std::string(descriptor.name());
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return absl::StrCat("getattr(", prefix, ", '", name, "')");
    } else {
      return absl::StrCat(prefix, separator, name);
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}